

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

ComponentData * __thiscall
HighsSymmetryDetection::computeComponentData
          (HighsSymmetryDetection *this,HighsSymmetries *symmetries)

{
  int iVar1;
  value_type vVar2;
  anon_class_8_1_56ae1867 comp_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  anon_class_16_2_164db4ee comp_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  HighsInt HVar3;
  int *piVar4;
  reference pvVar5;
  size_type sVar6;
  int iVar7;
  long in_RDX;
  HighsHashTable<int,_void> *in_RSI;
  ComponentData *in_RDI;
  HighsInt comp_1;
  HighsInt p;
  HighsInt i_3;
  HighsInt numUsedPerms;
  HighsInt i_2;
  HighsInt comp;
  HighsInt i_1;
  HighsHashTable<int,_void> currComponentOrbits;
  HighsInt currentComponent;
  HighsInt currentComponentStart;
  HighsInt pos;
  HighsInt j;
  HighsInt *perm;
  HighsInt i;
  ComponentData *componentData;
  undefined4 in_stack_fffffffffffffea8;
  HighsInt in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  HighsInt in_stack_fffffffffffffeb4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffeb8;
  vector<int,_std::allocator<int>_> *__x;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  HighsInt in_stack_fffffffffffffec8;
  HighsInt in_stack_fffffffffffffecc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  HighsInt in_stack_fffffffffffffedc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  ComponentData *args;
  int local_e0;
  int local_c0;
  int local_b4;
  int local_88;
  int local_44;
  int local_38;
  
  args = in_RDI;
  ComponentData::ComponentData
            ((ComponentData *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  HighsDisjointSets<false>::reset
            ((HighsDisjointSets<false> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (value_type_conflict2 *)0x6ca210);
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (value_type_conflict2 *)0x6ca245);
  for (local_38 = 0; local_38 < *(int *)(in_RDX + 0xd0); local_38 = local_38 + 1) {
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x6ca27e);
    iVar7 = local_38 *
            *(int *)&in_RSI[0x11].metadata._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    for (local_44 = 0;
        local_44 <
        *(int *)&in_RSI[0x11].metadata._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl; local_44 = local_44 + 1
        ) {
      iVar1 = piVar4[(long)iVar7 + (long)local_44];
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 5),(long)local_44);
      if (iVar1 != *pvVar5) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&in_RSI[4].tableSizeMask,
                            (long)piVar4[(long)iVar7 + (long)local_44]);
        vVar2 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->numUnfixed,(long)local_38);
        *pvVar5 = *pvVar5 + 1;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->firstUnfixed,(long)local_38);
        if (*pvVar5 == -1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->firstUnfixed,(long)local_38);
          *pvVar5 = vVar2;
        }
        else {
          std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->firstUnfixed,(long)local_38);
          HighsDisjointSets<false>::merge
                    ((HighsDisjointSets<false> *)in_stack_fffffffffffffed0._M_current,
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffeb8,CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
            );
  _Var8._M_current._4_4_ = in_stack_fffffffffffffecc;
  _Var8._M_current._0_4_ = in_stack_fffffffffffffec8;
  std::vector<int,std::allocator<int>>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),in_stack_fffffffffffffed0
             ,_Var8);
  _Var8._M_current = (int *)&in_RDI->componentSets;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  end_00._M_current._4_4_ = in_stack_fffffffffffffedc;
  end_00._M_current._0_4_ = in_stack_fffffffffffffed8;
  comp_01.componentData._4_4_ = in_stack_fffffffffffffecc;
  comp_01.componentData._0_4_ = in_stack_fffffffffffffec8;
  comp_01.this = (HighsSymmetryDetection *)in_stack_fffffffffffffed0._M_current;
  pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
            (_Var8,end_00,comp_01);
  local_88 = -1;
  HighsHashTable<int,_void>::HighsHashTable
            ((HighsHashTable<int,_void> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  for (local_b4 = 0;
      local_b4 <
      *(int *)&in_RSI[0x11].metadata._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl; local_b4 = local_b4 + 1)
  {
    in_stack_fffffffffffffed0._M_current = (int *)&in_RSI[4].tableSizeMask;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->componentSets,(long)local_b4);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current,
               (long)*pvVar5);
    HVar3 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)in_stack_fffffffffffffed0._M_current,
                       in_stack_fffffffffffffecc);
    in_stack_fffffffffffffedc = HVar3;
    in_stack_fffffffffffffecc =
         HighsDisjointSets<false>::getSetSize
                   ((HighsDisjointSets<false> *)
                    CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    in_stack_fffffffffffffeac);
    if (in_stack_fffffffffffffecc == 1) break;
    if (HVar3 != local_88) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      std::vector<int,_std::allocator<int>_>::emplace_back<>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      HighsHashTable<int,_void>::clear
                ((HighsHashTable<int,_void> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      local_88 = HVar3;
    }
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->componentSets,(long)local_b4);
    in_stack_fffffffffffffec8 =
         getOrbit((HighsSymmetryDetection *)
                  CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                  (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    in_stack_fffffffffffffec7 = HighsHashTable<int,_void>::insert<int>(in_RSI,(int *)args);
    if ((bool)in_stack_fffffffffffffec7) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      *pvVar5 = *pvVar5 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)_Var8._M_current,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  for (local_c0 = 0; local_c0 < *(int *)(in_RDX + 0xd0); local_c0 = local_c0 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->firstUnfixed,(long)local_c0);
    if (*pvVar5 != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
    }
  }
  __x = &in_RDI->permComponents;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  end._M_current._4_4_ = in_stack_fffffffffffffecc;
  end._M_current._0_4_ = in_stack_fffffffffffffec8;
  comp_00.componentData._7_1_ = in_stack_fffffffffffffec7;
  comp_00.componentData._0_7_ = in_stack_fffffffffffffec0;
  pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1>
            (in_stack_fffffffffffffed0,end,comp_00);
  local_88 = -1;
  sVar6 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->permComponents);
  for (local_e0 = 0; local_e0 < (int)sVar6; local_e0 = local_e0 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->permComponents,(long)local_e0);
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->firstUnfixed,(long)*pvVar5);
    HVar3 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)in_stack_fffffffffffffed0._M_current,
                       in_stack_fffffffffffffecc);
    in_stack_fffffffffffffeb4 = HVar3;
    if (HVar3 != local_88) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (value_type_conflict2 *)__x);
      local_88 = HVar3;
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (value_type_conflict2 *)__x);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
             (value_type_conflict2 *)__x);
  HighsHashTable<int,_void>::~HighsHashTable
            ((HighsHashTable<int,_void> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return args;
}

Assistant:

HighsSymmetryDetection::ComponentData
HighsSymmetryDetection::computeComponentData(
    const HighsSymmetries& symmetries) {
  ComponentData componentData;

  componentData.components.reset(numActiveCols);
  componentData.firstUnfixed.assign(symmetries.numPerms, -1);
  componentData.numUnfixed.assign(symmetries.numPerms, 0);
  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    const HighsInt* perm = symmetries.permutations.data() + i * numActiveCols;

    for (HighsInt j = 0; j < numActiveCols; ++j) {
      if (perm[j] != vertexGroundSet[j]) {
        HighsInt pos = vertexPosition[perm[j]];
        componentData.numUnfixed[i] += 1;
        if (componentData.firstUnfixed[i] != -1)
          componentData.components.merge(componentData.firstUnfixed[i], pos);
        else
          componentData.firstUnfixed[i] = pos;
      }
    }
  }

  componentData.componentSets.assign(vertexGroundSet.begin(),
                                     vertexGroundSet.begin() + numActiveCols);
  pdqsort(componentData.componentSets.begin(),
          componentData.componentSets.end(), [&](HighsInt u, HighsInt v) {
            HighsInt uComp = componentData.components.getSet(vertexPosition[u]);
            HighsInt vComp = componentData.components.getSet(vertexPosition[v]);
            return std::make_pair(
                       componentData.components.getSetSize(uComp) == 1, uComp) <
                   std::make_pair(
                       componentData.components.getSetSize(vComp) == 1, vComp);
          });

  HighsInt currentComponentStart = -1;
  HighsInt currentComponent = -1;
  HighsHashTable<HighsInt> currComponentOrbits;
  for (HighsInt i = 0; i < numActiveCols; ++i) {
    HighsInt comp = componentData.components.getSet(
        vertexPosition[componentData.componentSets[i]]);
    if (componentData.components.getSetSize(comp) == 1) break;
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.componentStarts.push_back(currentComponentStart);
      componentData.componentNumber.push_back(currentComponent);
      componentData.componentNumOrbits.emplace_back();
      currComponentOrbits.clear();
    }

    if (currComponentOrbits.insert(getOrbit(componentData.componentSets[i]))) {
      ++componentData.componentNumOrbits.back();
    }
  }

  componentData.permComponents.reserve(symmetries.numPerms);

  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    if (componentData.firstUnfixed[i] == -1) continue;
    componentData.permComponents.push_back(i);
  }

  pdqsort(componentData.permComponents.begin(),
          componentData.permComponents.end(), [&](HighsInt i, HighsInt j) {
            HighsInt seti =
                componentData.components.getSet(componentData.firstUnfixed[i]);
            HighsInt setj =
                componentData.components.getSet(componentData.firstUnfixed[j]);
            return std::make_pair(seti, componentData.numUnfixed[i]) <
                   std::make_pair(setj, componentData.numUnfixed[j]);
          });

  currentComponentStart = -1;
  currentComponent = -1;

  HighsInt numUsedPerms = componentData.permComponents.size();

  for (HighsInt i = 0; i < numUsedPerms; ++i) {
    HighsInt p = componentData.permComponents[i];
    HighsInt comp =
        componentData.components.getSet(componentData.firstUnfixed[p]);
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.permComponentStarts.push_back(currentComponentStart);
    }
  }

  assert(componentData.permComponentStarts.size() ==
         componentData.componentStarts.size());
  componentData.permComponentStarts.push_back(numUsedPerms);

  // HighsInt numComponents = componentData.componentStarts.size();
  // printf("found %d components\n", numComponents);
  componentData.componentStarts.push_back(numActiveCols);

  return componentData;
}